

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O0

int gauden_floor_variance(gauden_t *g)

{
  float64 fVar1;
  uint local_1c;
  uint local_18;
  uint32 k;
  uint32 j;
  uint32 i;
  gauden_t *g_local;
  
  if (g->fullvar != (vector_t ****)0x0) {
    for (k = 0; k < g->n_mgau; k = k + 1) {
      for (local_18 = 0; local_18 < g->n_feat; local_18 = local_18 + 1) {
        for (local_1c = 0; local_1c < g->n_density; local_1c = local_1c + 1) {
          fVar1 = determinant((float32 **)g->fullvar[k][local_18][local_1c],g->veclen[local_18]);
          if ((double)fVar1 <= 0.0) {
            diag_and_floor(g->fullvar[k][local_18][local_1c],g->veclen[local_18],min_var);
          }
        }
      }
    }
  }
  if (g->var != (vector_t ***)0x0) {
    for (k = 0; k < g->n_mgau; k = k + 1) {
      for (local_18 = 0; local_18 < g->n_feat; local_18 = local_18 + 1) {
        for (local_1c = 0; local_1c < g->n_density; local_1c = local_1c + 1) {
          vector_floor(g->var[k][local_18][local_1c],g->veclen[local_18],min_var);
        }
      }
    }
  }
  return 0;
}

Assistant:

int
gauden_floor_variance(gauden_t *g)
{
    uint32 i, j, k;

    if (g->fullvar != NULL) {
	/* Don't try to "floor" full covariances since there's no easy
	   way to do this.  If they are singular, discard the
	   off-diagonals and floor the diagonals. */
	for (i = 0; i < g->n_mgau; i++) {
	    for (j = 0; j < g->n_feat; j++) {
		for (k = 0; k < g->n_density; k++) {
		    if (determinant(g->fullvar[i][j][k], g->veclen[j]) <= 0.0) {
			diag_and_floor(g->fullvar[i][j][k], g->veclen[j], min_var);
		    }
		}
	    }
	}
    }
    if (g->var != NULL) {
	for (i = 0; i < g->n_mgau; i++) {
	    for (j = 0; j < g->n_feat; j++) {
		for (k = 0; k < g->n_density; k++) {
		    vector_floor(g->var[i][j][k], g->veclen[j], min_var);
		}
	    }
	}
    }

    return S3_SUCCESS;
}